

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double getVariance(Mat *inputImg,int y,int x)

{
  undefined1 auVar1 [16];
  _InputArray *p_Var2;
  uint uVar3;
  uint uVar5;
  double dVar4;
  int iVar6;
  int iVar7;
  Scalar stddev;
  Scalar mean;
  Mat tempMat;
  _InputArray local_150;
  _OutputArray local_138;
  _OutputArray local_120;
  uint local_108;
  uint uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [96];
  Mat local_78 [96];
  
  local_e8._8_8_ = local_e8._0_8_;
  iVar6 = x - (uint)(0 < x);
  iVar7 = y - (uint)(0 < y);
  uVar3 = -(uint)((int)(x + 1U) < (int)((ulong)*(undefined8 *)(inputImg + 8) >> 0x20));
  uVar5 = -(uint)((int)(y + 1U) < (int)*(undefined8 *)(inputImg + 8));
  local_108 = ~uVar3 & x | x + 1U & uVar3;
  uStack_104 = ~uVar5 & y | y + 1U & uVar5;
  uStack_100 = 0;
  uStack_fc = 0;
  cv::Mat::Mat(local_78);
  local_150.obj = (void *)CONCAT44((uStack_104 - iVar7) + 1,(local_108 - iVar6) + 1);
  local_150.flags = iVar6;
  local_150._4_4_ = iVar7;
  cv::Mat::Mat((Mat *)local_d8,inputImg,(Rect_ *)&local_150);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_e8._8_8_;
  local_e8 = auVar1 << 0x40;
  local_f8._0_4_ = 0x2010000;
  local_f8._8_8_ = local_78;
  cv::Mat::copyTo((_OutputArray *)local_d8);
  cv::Mat::~Mat((Mat *)local_d8);
  local_d8._16_16_ = (undefined1  [16])0x0;
  local_d8._0_16_ = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_150.sz.width = 0;
  local_150.sz.height = 0;
  local_150.flags = 0x1010000;
  local_120.super__InputArray.flags = -0x3dfdfffa;
  local_120.super__InputArray.sz.width = 1;
  local_120.super__InputArray.sz.height = 4;
  local_138.super__InputArray.flags = -0x3dfdfffa;
  local_138.super__InputArray.sz.width = 1;
  local_138.super__InputArray.sz.height = 4;
  local_150.obj = local_78;
  local_138.super__InputArray.obj = local_f8;
  local_120.super__InputArray.obj = (Mat *)local_d8;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_150,&local_120,&local_138,p_Var2);
  dVar4 = (double)local_f8._0_8_ * (double)local_f8._0_8_;
  cv::Mat::~Mat(local_78);
  return dVar4;
}

Assistant:

double getVariance(Mat &inputImg, int y , int x) {
    int lowerBoundY = y -1 >=  0? y -1 : y;
    int upperBoundY = y + 1 < inputImg.rows? y + 1 : y;
    int lowerBoundX = x - 1 >= 0? x -1  :  x;
    int upperBoundX = x + 1 < inputImg.cols? x + 1 : x;
    Mat tempMat;
    int length = (upperBoundY - lowerBoundY) + 1;
    int width = (upperBoundX - lowerBoundX) + 1;
    inputImg(Rect(lowerBoundX, lowerBoundY, width, length)).copyTo(tempMat);
    Scalar mean, stddev;
    meanStdDev(tempMat, mean, stddev);
    return stddev.val[0] * stddev.val[0];
}